

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O1

type __thiscall
cm::String::operator+=
          (String *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  pointer pcVar1;
  type pSVar2;
  string r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::reserve((ulong)&local_40);
  std::__cxx11::string::_M_replace
            ((ulong)&local_40,0,(char *)local_40._M_string_length,(ulong)(this->view_)._M_str);
  std::__cxx11::string::append((char *)&local_40,(ulong)pcVar1);
  pSVar2 = operator=(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return pSVar2;
}

Assistant:

typename std::enable_if<AsStringView<T>::value, String&>::type operator+=(
    T&& s)
  {
    string_view v = AsStringView<T>::view(std::forward<T>(s));
    std::string r;
    r.reserve(size() + v.size());
    r.assign(data(), size());
    r.append(v.data(), v.size());
    return *this = std::move(r);
  }